

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,REF_GRID ref_grid)

{
  REF_FACE pRVar1;
  uint uVar2;
  REF_SHARD pRVar3;
  REF_INT *pRVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  
  pRVar3 = (REF_SHARD)malloc(0x18);
  *ref_shard_ptr = pRVar3;
  if (pRVar3 == (REF_SHARD)0x0) {
    pcVar7 = "malloc *ref_shard_ptr of REF_SHARD_STRUCT NULL";
    uVar6 = 0x23;
  }
  else {
    pRVar3->grid = ref_grid;
    uVar2 = ref_face_create(&pRVar3->face,ref_grid);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x2a,
             "ref_shard_create",(ulong)uVar2,"create face");
      return uVar2;
    }
    pRVar1 = pRVar3->face;
    if ((long)pRVar1->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x2c,
             "ref_shard_create","malloc ref_shard->mark of REF_INT negative");
      return 1;
    }
    pRVar4 = (REF_INT *)malloc((long)pRVar1->n << 2);
    pRVar3->mark = pRVar4;
    if (pRVar4 != (REF_INT *)0x0) {
      if (0 < pRVar1->n) {
        lVar5 = 0;
        do {
          pRVar4[lVar5] = 0;
          lVar5 = lVar5 + 1;
        } while (lVar5 < pRVar1->n);
        return 0;
      }
      return 0;
    }
    pcVar7 = "malloc ref_shard->mark of REF_INT NULL";
    uVar6 = 0x2c;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar6,
         "ref_shard_create",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,
                                    REF_GRID ref_grid) {
  REF_SHARD ref_shard;
  REF_INT face;

  ref_malloc(*ref_shard_ptr, 1, REF_SHARD_STRUCT);

  ref_shard = *ref_shard_ptr;

  ref_shard_grid(ref_shard) = ref_grid;

  RSS(ref_face_create(&(ref_shard_face(ref_shard)), ref_shard_grid(ref_shard)),
      "create face");

  ref_malloc(ref_shard->mark, ref_face_n(ref_shard_face(ref_shard)), REF_INT);

  for (face = 0; face < ref_face_n(ref_shard_face(ref_shard)); face++)
    ref_shard_mark(ref_shard, face) = 0;

  return REF_SUCCESS;
}